

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>::
DeserializeUniValue(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                    *this,UniValue *value)

{
  bool bVar1;
  reference this_00;
  UniValue *in_RSI;
  DecodeRawTransactionTxOut *in_RDI;
  DecodeRawTransactionTxOut local_value;
  UniValue *element;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  vector<UniValue,_std::allocator<UniValue>_> *in_stack_fffffffffffffea8;
  value_type *in_stack_fffffffffffffeb8;
  vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  *in_stack_fffffffffffffec0;
  DecodeRawTransactionTxOut *in_stack_fffffffffffffed0;
  UniValue *in_stack_ffffffffffffffc8;
  __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> local_20;
  undefined8 local_18;
  
  bVar1 = UniValue::isArray(in_RSI);
  if (bVar1) {
    std::
    vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
    ::clear((vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
             *)0x45a7f8);
    local_18 = UniValue::getValues();
    local_20._M_current =
         (UniValue *)
         std::vector<UniValue,_std::allocator<UniValue>_>::begin(in_stack_fffffffffffffea8);
    std::vector<UniValue,_std::allocator<UniValue>_>::end(in_stack_fffffffffffffea8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffea8), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                ::operator*(&local_20);
      bVar1 = UniValue::isObject(this_00);
      if (bVar1) {
        in_stack_fffffffffffffea8 =
             (vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffec8;
        api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut(in_stack_fffffffffffffed0);
        JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut>::DeserializeUniValue
                  ((JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut> *)this_00,
                   in_stack_ffffffffffffffc8);
        std::
        vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
        ::push_back(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        api::json::DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut(in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++(&local_20);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (!value.isArray()) {
      return;
    }
    std::vector<TYPE>::clear();
    for (const auto& element : value.getValues()) {
      if (element.isObject()) {
        TYPE local_value;
        local_value.DeserializeUniValue(element);
        std::vector<TYPE>::push_back(local_value);
      }
    }
  }